

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool is_open;
  bool bVar8;
  int iVar9;
  ImU32 fill_col;
  ImGuiContext *g;
  byte bVar10;
  uint uVar11;
  float fVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool hovered;
  bool held;
  ImRect bb;
  char log_suffix [3];
  ImVec2 label_size;
  ImRect interact_bb;
  ImVec2 text_pos;
  char log_prefix [4];
  ImVec2 in_stack_fffffffffffffee8;
  bool local_10e;
  bool local_10d;
  ImGuiID local_10c;
  ImVec2 local_108;
  ImVec2 IStack_100;
  undefined1 local_f8 [16];
  undefined2 local_dc;
  undefined1 local_da;
  char local_d9;
  undefined1 local_d8 [16];
  ImVec2 local_c0;
  ImRect local_b8;
  char *local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ImVec2 local_78;
  float fStack_70;
  float fStack_6c;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  if (pIVar4->SkipItems == false) {
    fVar12 = 0.0;
    if ((flags & 2U) != 0) {
      fVar12 = (pIVar6->Style).FramePadding.y;
    }
    local_88._0_4_ = fVar12;
    if ((label_end == (char *)0x0) && (label_end = label, label != (char *)0xffffffffffffffff)) {
      do {
        if (*label_end == '#') {
          if (label_end[1] == '#') goto LAB_00169174;
        }
        else if (*label_end == '\0') goto LAB_00169174;
        label_end = label_end + 1;
      } while (label_end != (char *)0xffffffffffffffff);
      label_end = (char *)0xffffffffffffffff;
    }
LAB_00169174:
    local_48 = ZEXT416((uint)(pIVar6->Style).FramePadding.x);
    local_10c = id;
    local_a8 = label;
    local_c0 = CalcTextSize(label,label_end,false,-1.0);
    fVar12 = (pIVar4->DC).CurrentLineHeight;
    fVar14 = (pIVar4->DC).CurrentLineTextBaseOffset - (float)local_88._0_4_;
    fVar14 = (float)(~-(uint)(fVar14 <= 0.0) & (uint)fVar14);
    fVar15 = (pIVar6->Style).FramePadding.y;
    fVar15 = fVar15 + fVar15 + pIVar6->FontSize;
    fVar16 = (float)local_88._0_4_ + (float)local_88._0_4_ + local_c0.y;
    if (fVar15 <= fVar12) {
      fVar12 = fVar15;
    }
    uVar11 = -(uint)(fVar16 <= fVar12);
    local_78.y = (float)(~uVar11 & (uint)fVar16 | (uint)fVar12 & uVar11);
    local_98._0_4_ = (pIVar4->Pos).x;
    pIVar5 = GImGui->CurrentWindow;
    IVar2 = (pIVar5->ContentsRegionRect).Max;
    IStack_100.x = IVar2.x;
    local_58 = ZEXT416((uint)fVar14);
    if ((pIVar5->DC).ColumnsCount != 1) {
      local_f8 = ZEXT416((uint)local_78.y);
      local_d8._8_8_ = 0;
      local_d8._0_4_ = IVar2.x;
      local_d8._4_4_ = IVar2.y;
      IStack_100.x = GetColumnOffset((pIVar5->DC).ColumnsCurrent + 1);
      IStack_100.x = IStack_100.x - (pIVar5->WindowPadding).x;
      fVar14 = (float)local_58._0_4_;
      local_78.y = (float)local_f8._0_4_;
    }
    IStack_100.x = (float)local_98._0_4_ + IStack_100.x;
    IStack_100.y = (pIVar4->DC).CursorPos.y + local_78.y;
    local_108 = (pIVar4->DC).CursorPos;
    if ((flags & 2U) == 0) {
      uVar13 = 0x40000000;
    }
    else {
      fVar12 = (float)(int)((pIVar4->WindowPadding).x * 0.5) + -1.0;
      local_108.x = local_108.x - fVar12;
      IStack_100.x = fVar12 + IStack_100.x;
      uVar13 = 0x40400000;
    }
    local_f8._0_4_ = uVar13;
    local_d8 = ZEXT416((uint)pIVar6->FontSize);
    local_78.x = (float)(-(uint)(0.0 < local_c0.x) &
                        (uint)((float)local_48._0_4_ + (float)local_48._0_4_ + local_c0.x)) +
                 pIVar6->FontSize;
    local_98 = ZEXT416((uint)local_78.x);
    ItemSize(&local_78,fVar14);
    if ((flags & 2U) == 0) {
      fVar12 = (pIVar6->Style).ItemSpacing.x;
      local_b8.Max.x = fVar12 + fVar12 + (float)local_98._0_4_ + local_108.x;
    }
    else {
      local_b8.Max.x = IStack_100.x;
    }
    local_b8.Min = local_108;
    local_b8.Max.y = IStack_100.y;
    is_open = TreeNodeBehaviorIsOpen(local_10c,flags);
    bVar8 = ItemAdd(&local_b8,&local_10c);
    if (bVar8) {
      local_d8._0_4_ = (float)local_d8._0_4_ + (float)local_f8._0_4_ * (float)local_48._0_4_;
      bVar8 = ButtonBehavior(&local_b8,local_10c,&local_10e,&local_10d,
                             (((uint)flags >> 6 & 2 | 0x10) & (flags << 0x19) >> 0x1f) +
                             (flags & 4U) * 0x100 + 0x200);
      if ((((uint)flags >> 8 & 1) == 0) && (bVar8)) {
        bVar10 = (flags & 0xc0U) == 0;
        if ((char)flags < '\0') {
          local_f8[0] = (flags & 0xc0U) == 0;
          local_78.y = local_b8.Max.y;
          local_78.x = local_b8.Min.x + (float)local_d8._0_4_;
          bVar8 = IsMouseHoveringRect(&local_b8.Min,&local_78,true);
          bVar10 = bVar8 | local_f8[0];
        }
        if ((flags & 0x40U) != 0) {
          bVar10 = bVar10 | (pIVar6->IO).MouseDoubleClicked[0];
        }
        if (bVar10 != 0) {
          is_open = !is_open;
          ImGuiStorage::SetInt((pIVar4->DC).StateStorage,local_10c,(uint)is_open);
        }
      }
      pIVar7 = GImGui;
      if ((flags & 4U) != 0) {
        IVar3 = (GImGui->CurrentWindow->DC).LastItemId;
        if (GImGui->HoveredId == IVar3) {
          GImGui->HoveredIdAllowOverlap = true;
        }
        if (pIVar7->ActiveId == IVar3) {
          pIVar7->ActiveIdAllowOverlap = true;
        }
      }
      pIVar7 = GImGui;
      if ((local_10d != true) || (iVar9 = 0x1b, local_10e == false)) {
        iVar9 = local_10e + 0x19;
      }
      pIVar1 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar9 << 4));
      local_78 = *pIVar1;
      IVar2 = pIVar1[1];
      fStack_6c = IVar2.y;
      fStack_70 = IVar2.x;
      fStack_6c = (GImGui->Style).Alpha * fStack_6c;
      fill_col = ColorConvertFloat4ToU32((ImVec4 *)&local_78);
      fVar12 = (float)local_88._0_4_ + (float)local_58._0_4_ + local_108.y;
      local_a0.y = fVar12;
      local_a0.x = (float)local_d8._0_4_ + local_108.x;
      if ((flags & 2U) == 0) {
        local_88._4_4_ = fVar12;
        local_88._0_4_ = (float)local_d8._0_4_ + local_108.x;
        local_88._8_4_ = local_d8._4_4_;
        local_88._12_4_ = 0;
        if (((flags & 1U) != 0) || (fVar12 = local_108.y, fVar15 = local_108.x, local_10e != false))
        {
          local_60.y = IStack_100.y;
          local_60.x = IStack_100.x;
          local_78 = local_108;
          pIVar4 = pIVar7->CurrentWindow;
          pIVar4->Accessed = true;
          local_f8 = ZEXT416((uint)local_108.y);
          local_98._0_4_ = local_108.x;
          ImDrawList::AddRectFilled(pIVar4->DrawList,&local_78,&local_60,fill_col,0.0,-1);
          fVar12 = (float)local_f8._0_4_;
          fVar15 = (float)local_98._0_4_;
        }
        if (((uint)flags >> 9 & 1) == 0) {
          if (((uint)flags >> 8 & 1) == 0) {
            p_min.y = fVar12 + pIVar6->FontSize * 0.15 + (float)local_58._0_4_;
            p_min.x = (float)local_48._0_4_ + fVar15;
            RenderCollapseTriangle(p_min,is_open,0.7);
          }
        }
        else {
          RenderBullet(in_stack_fffffffffffffee8);
        }
        if (pIVar6->LogEnabled == true) {
          LogRenderedText(&local_a0,">",(char *)0x0);
        }
        RenderText((ImVec2)local_88._0_8_,local_a8,label_end,false);
      }
      else {
        p_max.y = IStack_100.y;
        p_max.x = IStack_100.x;
        local_f8 = ZEXT416((uint)local_108.y);
        RenderFrame(local_108,p_max,fill_col,true,(pIVar6->Style).FrameRounding);
        IVar2.y = (float)local_58._0_4_ + (float)local_88._0_4_ + (float)local_f8._0_4_;
        IVar2.x = (float)local_48._0_4_ + local_108.x + 0.0;
        RenderCollapseTriangle(IVar2,is_open,1.0);
        if (pIVar6->LogEnabled == true) {
          local_60.x = 3.226812e-39;
          local_da = 0;
          local_dc = 0x2323;
          LogRenderedText(&local_a0,(char *)&local_60,(char *)((long)&local_60.x + 3));
          local_78.x = 0.0;
          local_78.y = 0.0;
          RenderTextClipped(&local_a0,&IStack_100,local_a8,label_end,&local_c0,&local_78,
                            (ImRect *)0x0);
          LogRenderedText(&local_a0,(char *)((long)&local_dc + 1),&local_d9);
        }
        else {
          local_78.x = 0.0;
          local_78.y = 0.0;
          RenderTextClipped(&local_a0,&IStack_100,local_a8,label_end,&local_c0,&local_78,
                            (ImRect *)0x0);
        }
      }
    }
    if (is_open == true && (char)((flags & 8U) >> 3) == '\0') {
      TreePushRawID(local_10c);
    }
  }
  else {
    is_open = false;
  }
  return is_open;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = display_frame ? style.FramePadding : ImVec2(style.FramePadding.x, 0.0f);

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float text_base_offset_y = ImMax(0.0f, window->DC.CurrentLineTextBaseOffset - padding.y); // Latch before ItemSize changes it
    const float frame_height = ImMax(ImMin(window->DC.CurrentLineHeight, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect bb = ImRect(window->DC.CursorPos, ImVec2(window->Pos.x + GetContentRegionMax().x, window->DC.CursorPos.y + frame_height));
    if (display_frame)
    {
        // Framed header expand a little outside the default padding
        bb.Min.x -= (float)(int)(window->WindowPadding.x*0.5f) - 1;
        bb.Max.x += (float)(int)(window->WindowPadding.x*0.5f) - 1;
    }

    const float text_offset_x = (g.FontSize + (display_frame ? padding.x*3 : padding.x*2));   // Collapser arrow width + Spacing
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);   // Include collapser
    ItemSize(ImVec2(text_width, frame_height), text_base_offset_y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    // (Ideally we'd want to add a flag for the user to specify we want want the hit test to be done up to the right side of the content or not)
    const ImRect interact_bb = display_frame ? bb : ImRect(bb.Min.x, bb.Min.y, bb.Min.x + text_width + style.ItemSpacing.x*2, bb.Max.y);
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (!ItemAdd(interact_bb, &id))
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushRawID(id);
        return is_open;
    }

    // Flags that affects opening behavior:
    // - 0(default) ..................... single-click anywhere to open
    // - OpenOnDoubleClick .............. double-click anywhere to open
    // - OpenOnArrow .................... single-click on arrow to open
    // - OpenOnDoubleClick|OpenOnArrow .. single-click on arrow or double-click anywhere to open
    ImGuiButtonFlags button_flags = ImGuiButtonFlags_NoKeyModifiers | ((flags & ImGuiTreeNodeFlags_AllowOverlapMode) ? ImGuiButtonFlags_AllowOverlapMode : 0);
    if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnDoubleClick | ((flags & ImGuiTreeNodeFlags_OpenOnArrow) ? ImGuiButtonFlags_PressedOnClickRelease : 0);
    bool hovered, held, pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    if (pressed && !(flags & ImGuiTreeNodeFlags_Leaf))
    {
        bool toggled = !(flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick));
        if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
            toggled |= IsMouseHoveringRect(interact_bb.Min, ImVec2(interact_bb.Min.x + text_offset_x, interact_bb.Max.y));
        if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
            toggled |= g.IO.MouseDoubleClicked[0];
        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowOverlapMode)
        SetItemAllowOverlap();

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
    const ImVec2 text_pos = bb.Min + ImVec2(text_offset_x, padding.y + text_base_offset_y);
    if (display_frame)
    {
        // Framed type
        RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);
        RenderCollapseTriangle(bb.Min + padding + ImVec2(0.0f, text_base_offset_y), is_open, 1.0f);
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
            LogRenderedText(text_pos, log_suffix+1, log_suffix+3);
        }
        else
        {
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || (flags & ImGuiTreeNodeFlags_Selected))
            RenderFrame(bb.Min, bb.Max, col, false);

        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(bb.Min + ImVec2(text_offset_x * 0.5f, g.FontSize*0.50f + text_base_offset_y));
        else if (!(flags & ImGuiTreeNodeFlags_Leaf))
            RenderCollapseTriangle(bb.Min + ImVec2(padding.x, g.FontSize*0.15f + text_base_offset_y), is_open, 0.70f);
        if (g.LogEnabled)
            LogRenderedText(text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushRawID(id);
    return is_open;
}